

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

void defilter_sub3(size_t rowbytes,uchar *row)

{
  __m128i alVar1;
  __m128i v;
  __m128i d;
  __m128i a;
  undefined8 local_70;
  size_t rb;
  uchar *row_local;
  size_t rowbytes_local;
  
  rb = (size_t)row;
  for (local_70 = rowbytes; 3 < local_70; local_70 = local_70 - 3) {
    alVar1 = load4((void *)rb);
    v[1] = alVar1[1];
    v[0] = (longlong)row;
    store3((void *)rb,v);
    rb = rb + 3;
  }
  if (local_70 != 0) {
    alVar1 = load3((void *)rb);
    alVar1[0] = (longlong)row;
    store3((void *)rb,alVar1);
  }
  return;
}

Assistant:

static void defilter_sub3(size_t rowbytes, unsigned char *row)
{
    /* The Sub filter predicts each pixel as the previous pixel, a.
     * There is no pixel to the left of the first pixel.  It's encoded directly.
     * That works with our main loop if we just say that left pixel was zero.
     */
    size_t rb = rowbytes;

    __m128i a, d = _mm_setzero_si128();

    while(rb >= 4)
    {
        a = d; d = load4(row);
        d = _mm_add_epi8(d, a);
        store3(row, d);

        row += 3;
        rb  -= 3;
    }

    if(rb > 0)
    {
        a = d; d = load3(row);
        d = _mm_add_epi8(d, a);
        store3(row, d);
    }
}